

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_unziplo_16(c_v128 a,c_v128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  c_v128 cVar6;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[1];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = b.u64[1];
  auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
  auVar3 = vpsllq_avx(auVar2,0x10);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = a.u64[0];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = b.u64[0];
  auVar1 = vpunpcklqdq_avx(auVar5,auVar4);
  auVar1 = vpshufb_avx(auVar1,_DAT_00c22740);
  auVar2 = vpsllq_avx(auVar2,0x20);
  auVar1 = vpblendd_avx2(auVar1,auVar2,10);
  auVar1 = vpblendw_avx(auVar1,auVar3,0x88);
  cVar6._8_8_ = vpextrq_avx(auVar1,1);
  cVar6.u64[0] = auVar1._0_8_;
  return cVar6;
}

Assistant:

SIMD_INLINE c_v128 _c_v128_unzip_16(c_v128 a, c_v128 b, int mode) {
  c_v128 t;
  if (mode) {
    t.u16[7] = b.u16[7];
    t.u16[6] = b.u16[5];
    t.u16[5] = b.u16[3];
    t.u16[4] = b.u16[1];
    t.u16[3] = a.u16[7];
    t.u16[2] = a.u16[5];
    t.u16[1] = a.u16[3];
    t.u16[0] = a.u16[1];
  } else {
    t.u16[7] = a.u16[6];
    t.u16[6] = a.u16[4];
    t.u16[5] = a.u16[2];
    t.u16[4] = a.u16[0];
    t.u16[3] = b.u16[6];
    t.u16[2] = b.u16[4];
    t.u16[1] = b.u16[2];
    t.u16[0] = b.u16[0];
  }
  return t;
}